

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int propagateConstants(Parse *pParse,Select *p)

{
  sqlite3 *in_RSI;
  Expr *in_RDI;
  long in_FS_OFFSET;
  int nChng;
  Walker w;
  WhereConst x;
  undefined4 in_stack_ffffffffffffff88;
  int iVar1;
  Expr *in_stack_ffffffffffffffa0;
  undefined1 local_30 [8];
  long local_28;
  int local_20;
  int local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_30,0xaa,0x28);
  memset(&stack0xffffffffffffffa0,0xaa,0x30);
  iVar1 = 0;
  local_28 = *(long *)in_RDI + 0x67;
  do {
    local_20 = 0;
    local_1c = 0;
    local_10 = 0;
    local_18 = 0;
    if (((((anon_union_8_18_67db040d_for_u *)&in_RSI->nDb)->pNC == (NameContext *)0x0) ||
        (((anon_union_8_18_67db040d_for_u *)&in_RSI->nDb)->pSrcList->nSrc < 1)) ||
       ((((anon_union_8_18_67db040d_for_u *)&in_RSI->nDb)->pNC->nRef & 0x40) == 0)) {
      local_14 = 1;
    }
    else {
      local_14 = 3;
    }
    findConstInWhere((WhereConst *)in_stack_ffffffffffffffa0,in_RDI);
    if (local_20 != 0) {
      memset(&stack0xffffffffffffffa0,0,0x30);
      in_stack_ffffffffffffffa0 = in_RDI;
      sqlite3WalkExpr((Walker *)in_RSI,(Expr *)CONCAT44(iVar1,in_stack_ffffffffffffff88));
      sqlite3DbFree(in_RSI,(void *)CONCAT44(iVar1,in_stack_ffffffffffffff88));
      iVar1 = local_1c + iVar1;
    }
  } while (local_1c != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int propagateConstants(
  Parse *pParse,   /* The parsing context */
  Select *p        /* The query in which to propagate constants */
){
  WhereConst x;
  Walker w;
  int nChng = 0;
  x.pParse = pParse;
  x.pOomFault = &pParse->db->mallocFailed;
  do{
    x.nConst = 0;
    x.nChng = 0;
    x.apExpr = 0;
    x.bHasAffBlob = 0;
    if( ALWAYS(p->pSrc!=0)
     && p->pSrc->nSrc>0
     && (p->pSrc->a[0].fg.jointype & JT_LTORJ)!=0
    ){
      /* Do not propagate constants on any ON clause if there is a
      ** RIGHT JOIN anywhere in the query */
      x.mExcludeOn = EP_InnerON | EP_OuterON;
    }else{
      /* Do not propagate constants through the ON clause of a LEFT JOIN */
      x.mExcludeOn = EP_OuterON;
    }
    findConstInWhere(&x, p->pWhere);
    if( x.nConst ){
      memset(&w, 0, sizeof(w));
      w.pParse = pParse;
      w.xExprCallback = propagateConstantExprRewrite;
      w.xSelectCallback = sqlite3SelectWalkNoop;
      w.xSelectCallback2 = 0;
      w.walkerDepth = 0;
      w.u.pConst = &x;
      sqlite3WalkExpr(&w, p->pWhere);
      sqlite3DbFree(x.pParse->db, x.apExpr);
      nChng += x.nChng;
    }
  }while( x.nChng );
  return nChng;
}